

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Di<(moira::Mode)5,_4> wrapper)

{
  char *pcVar1;
  An an;
  An an_00;
  
  switch(this->style->syntax) {
  case MOIRA:
  case MUSASHI:
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '(';
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = ',';
    break;
  case MOIRA_MIT:
  case GNU_MIT:
    an.raw._2_2_ = 0;
    an.raw._0_2_ = (wrapper.ea)->reg;
    operator<<(this,an);
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '@';
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '(';
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    goto LAB_002875fd;
  case GNU:
    operator<<(this,(Int)(int)(short)(wrapper.ea)->ext1);
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '(';
    break;
  default:
    goto switchD_0028755f_default;
  }
  an_00.raw._2_2_ = 0;
  an_00.raw._0_2_ = (wrapper.ea)->reg;
  operator<<(this,an_00);
LAB_002875fd:
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = ')';
switchD_0028755f_default:
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Di<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

        case Syntax::MOIRA:
        case Syntax::MUSASHI:

            *this << "(" << Int{(i16)ea.ext1} << "," << An{ea.reg} << ")";
            return *this;

       case Syntax::GNU:

            *this << Int{(i16)ea.ext1} << "(" << An{ea.reg} << ")";
            break;

        case Syntax::GNU_MIT:
        case Syntax::MOIRA_MIT:

            *this << An{ea.reg} << "@(" << Int{(i16)ea.ext1} << ")";
            break;
    }

    return *this;
}